

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_pivot.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PhysicalPivot::Execute
          (PhysicalPivot *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate,OperatorState *state)

{
  vector<duckdb::Value,_true> *this_00;
  data_ptr_t pdVar1;
  DataChunk *pDVar2;
  reference pvVar3;
  reference other;
  Vector *pVVar4;
  const_reference value;
  const_iterator cVar5;
  InternalException *this_01;
  size_type __n;
  ulong uVar6;
  idx_t i;
  ulong uVar7;
  idx_t __n_00;
  PhysicalPivot *pPVar8;
  long *plVar9;
  allocator local_c9;
  PhysicalPivot *local_c8;
  DataChunk *local_c0;
  long local_b8;
  long local_b0;
  data_ptr_t local_a8;
  data_ptr_t local_a0;
  _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_long>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_98;
  data_ptr_t local_90;
  ulong local_88;
  long local_80;
  long local_78;
  Value local_70;
  
  local_c8 = this;
  local_c0 = input;
  DataChunk::Flatten(input);
  for (uVar7 = 0; pDVar2 = local_c0, uVar7 < (local_c8->bound_pivot).group_count; uVar7 = uVar7 + 1)
  {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar7);
    other = vector<duckdb::Vector,_true>::get<true>(&local_c0->data,uVar7);
    Vector::Reference(pvVar3,other);
  }
  pvVar3 = vector<duckdb::Vector,_true>::back(&local_c0->data);
  local_a0 = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::back(&pDVar2->data);
  pVVar4 = ListVector::GetEntry(pvVar3);
  local_a8 = pVVar4->data;
  this_00 = &local_c8->empty_aggregates;
  __n = 0;
  for (__n_00 = (local_c8->bound_pivot).group_count;
      __n_00 < (ulong)(((long)(chunk->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x68); __n_00 = __n_00 + 1)
  {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,__n_00);
    value = vector<duckdb::Value,_true>::get<true>(this_00,__n);
    Vector::Reference(pvVar3,value);
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,__n_00);
    Vector::Flatten(pvVar3,local_c0->count);
    __n = __n + 1;
    if ((ulong)((long)(local_c8->empty_aggregates).
                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_c8->empty_aggregates).
                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                      super__Vector_impl_data._M_start >> 6) <= __n) {
      __n = 0;
    }
  }
  local_98 = &(local_c8->pivot_map)._M_h;
  uVar7 = 0;
  pPVar8 = local_c8;
  do {
    if (local_c0->count <= uVar7) {
      chunk->count = local_c0->count;
      return NEED_MORE_INPUT;
    }
    local_80 = uVar7 * 0x10;
    local_b8 = *(long *)(local_a0 + local_80 + 8);
    local_90 = local_a8 + *(long *)(local_a0 + local_80) * 0x10;
    local_88 = uVar7;
    for (local_b0 = 0; local_b0 != local_b8; local_b0 = local_b0 + 1) {
      cVar5 = ::std::
              _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_long>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_98,(key_type *)(local_90 + local_b0 * 0x10));
      if (cVar5.super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true>.
          _M_cur != (__node_type *)0x0) {
        local_78 = *(long *)((long)cVar5.
                                   super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true>
                                   ._M_cur + 0x18);
        for (uVar6 = 0; pDVar2 = local_c0,
            uVar6 < (ulong)((long)(pPVar8->empty_aggregates).
                                  super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pPVar8->empty_aggregates).
                                  super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 6); uVar6 = uVar6 + 1)
        {
          pvVar3 = vector<duckdb::Vector,_true>::get<true>
                             (&local_c0->data,(pPVar8->bound_pivot).group_count + uVar6);
          pdVar1 = pvVar3->data;
          pvVar3 = vector<duckdb::Vector,_true>::get<true>
                             (&pDVar2->data,(pPVar8->bound_pivot).group_count + uVar6);
          pVVar4 = ListVector::GetEntry(pvVar3);
          if (local_b8 != *(long *)(pdVar1 + local_80 + 8)) {
            this_01 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_70,"Pivot - unaligned lists between values and columns!?",
                       &local_c9);
            InternalException::InternalException(this_01,(string *)&local_70);
            __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          plVar9 = (long *)(pdVar1 + local_80);
          pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,local_78 + uVar6);
          Vector::GetValue(&local_70,pVVar4,*plVar9 + local_b0);
          uVar7 = local_88;
          Vector::SetValue(pvVar3,local_88,&local_70);
          Value::~Value(&local_70);
          pPVar8 = local_c8;
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

OperatorResultType PhysicalPivot::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                          GlobalOperatorState &gstate, OperatorState &state) const {
	// copy the groups as-is
	input.Flatten();
	for (idx_t i = 0; i < bound_pivot.group_count; i++) {
		chunk.data[i].Reference(input.data[i]);
	}
	auto pivot_column_lists = FlatVector::GetData<list_entry_t>(input.data.back());
	auto &pivot_column_values = ListVector::GetEntry(input.data.back());
	auto pivot_columns = FlatVector::GetData<string_t>(pivot_column_values);

	// initialize all aggregate columns with the empty aggregate value
	// if there are multiple aggregates the columns are in order of [AGGR1][AGGR2][AGGR1][AGGR2]
	// so we need to alternate the empty_aggregate that we use
	idx_t aggregate = 0;
	for (idx_t c = bound_pivot.group_count; c < chunk.ColumnCount(); c++) {
		chunk.data[c].Reference(empty_aggregates[aggregate]);
		chunk.data[c].Flatten(input.size());
		aggregate++;
		if (aggregate >= empty_aggregates.size()) {
			aggregate = 0;
		}
	}

	// move the pivots to the given columns
	for (idx_t r = 0; r < input.size(); r++) {
		auto list = pivot_column_lists[r];
		for (idx_t l = 0; l < list.length; l++) {
			// figure out the column value number of this list
			auto &column_name = pivot_columns[list.offset + l];
			auto entry = pivot_map.find(column_name);
			if (entry == pivot_map.end()) {
				// column entry not found in map - that means this element is explicitly excluded from the pivot list
				continue;
			}
			auto column_idx = entry->second;
			for (idx_t aggr = 0; aggr < empty_aggregates.size(); aggr++) {
				auto pivot_value_lists = FlatVector::GetData<list_entry_t>(input.data[bound_pivot.group_count + aggr]);
				auto &pivot_value_child = ListVector::GetEntry(input.data[bound_pivot.group_count + aggr]);
				if (list.length != pivot_value_lists[r].length) {
					throw InternalException("Pivot - unaligned lists between values and columns!?");
				}
				chunk.data[column_idx + aggr].SetValue(r, pivot_value_child.GetValue(pivot_value_lists[r].offset + l));
			}
		}
	}
	chunk.SetCardinality(input.size());
	return OperatorResultType::NEED_MORE_INPUT;
}